

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O2

fourcc_t EBML_IdFromBuffer(uint8_t *PossibleId,int8_t IdLength)

{
  uint uVar1;
  undefined3 in_register_00000031;
  int iVar2;
  long lStack_8;
  
  iVar2 = CONCAT31(in_register_00000031,IdLength);
  uVar1 = (uint)*PossibleId;
  if (iVar2 != 1) {
    if (iVar2 == 3) {
      uVar1 = (uint)PossibleId[1] << 8 | uVar1 << 0x10;
      lStack_8 = 2;
    }
    else if (iVar2 == 2) {
      uVar1 = (uint)*PossibleId << 8;
      lStack_8 = 1;
    }
    else {
      uVar1 = (uint)PossibleId[2] << 8 | (uint)PossibleId[1] << 0x10 | uVar1 << 0x18;
      lStack_8 = 3;
    }
    uVar1 = PossibleId[lStack_8] | uVar1;
  }
  return uVar1;
}

Assistant:

static fourcc_t EBML_IdFromBuffer(const uint8_t *PossibleId, int8_t IdLength)
{
    if (IdLength == 1)
        return FOURCCBE(0,0,0,PossibleId[0]);
    if (IdLength == 2)
        return FOURCCBE(0,0,PossibleId[0],PossibleId[1]);
    if (IdLength == 3)
        return FOURCCBE(0,PossibleId[0],PossibleId[1],PossibleId[2]);
    return FOURCCBE(PossibleId[0],PossibleId[1],PossibleId[2],PossibleId[3]);
}